

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestFunctions.cpp
# Opt level: O2

void __thiscall SixteenOneActive3::getDerivative(SixteenOneActive3 *this,double *x,double *y)

{
  int i;
  long lVar1;
  double dVar2;
  double dVar3;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    y[lVar1] = 0.0;
  }
  dVar2 = sin(x[3] + x[0xf]);
  y[2] = dVar2;
  dVar2 = x[2];
  dVar3 = cos(x[3] + x[0xf]);
  y[3] = dVar3 * dVar2;
  dVar2 = x[2];
  dVar3 = cos(x[3] + x[0xf]);
  y[0xf] = dVar3 * dVar2;
  return;
}

Assistant:

void SixteenOneActive3::getDerivative(const double x[], double y[]) const{
    for (int i=0; i<16; i++)
        y[i] = 0.0;
    y[2] = std::sin(x[3] + x[15]);
    y[3] = x[2] * std::cos(x[3] + x[15]);
    y[15] = x[2] * std::cos(x[3] + x[15]);
}